

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O1

void * mi_heap_alloc_new(mi_heap_t *heap,size_t size)

{
  long lVar1;
  undefined8 *puVar2;
  void *pvVar3;
  
  if (size < 0x401) {
    lVar1 = *(long *)((long)heap->pages_free_direct + (size + 7 & 0xfffffffffffffff8));
    puVar2 = *(undefined8 **)(lVar1 + 0x10);
    if (puVar2 != (undefined8 *)0x0) {
      *(undefined8 *)(lVar1 + 0x10) = *puVar2;
      *(short *)(lVar1 + 0x20) = *(short *)(lVar1 + 0x20) + 1;
      goto LAB_004eeaca;
    }
  }
  puVar2 = (undefined8 *)_mi_malloc_generic(heap,size,false,0);
LAB_004eeaca:
  if (puVar2 != (undefined8 *)0x0) {
    return puVar2;
  }
  pvVar3 = mi_heap_try_new(heap,size,false);
  return pvVar3;
}

Assistant:

void* mi_heap_alloc_new(mi_heap_t* heap, size_t size) {
  void* p = mi_heap_malloc(heap,size);
  if mi_unlikely(p == NULL) return mi_heap_try_new(heap, size, false);
  return p;
}